

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_transform.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListTransformBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  reference pvVar6;
  pointer pEVar7;
  BoundLambdaExpression *pBVar8;
  BinderException *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  undefined8 local_48;
  undefined8 auStack_40 [2];
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  if (pEVar7[9] == (Expression)0x29) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    _Var1._M_head_impl =
         (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    duckdb::BoundCastExpression::AddArrayCastToList(&local_50);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    _Var5._M_head_impl = local_50._M_head_impl;
    local_50._M_head_impl = (Expression *)0x0;
    _Var2._M_head_impl =
         (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
    if (local_50._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    local_50._M_head_impl = (Expression *)0x0;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    pBVar8 = BaseExpression::Cast<duckdb::BoundLambdaExpression>((BaseExpression *)pEVar7);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (pBVar8 + 0x58));
    duckdb::LogicalType::LIST((LogicalType *)&local_50);
    bound_function->field_0x90 = local_50._M_head_impl._0_1_;
    bound_function->field_0x91 = local_50._M_head_impl._1_1_;
    uVar3 = *(undefined8 *)&bound_function->field_0x98;
    uVar4 = *(undefined8 *)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = local_48;
    *(undefined8 *)&bound_function->field_0xa0 = auStack_40[0];
    local_48 = uVar3;
    auStack_40[0] = uVar4;
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_50);
    LambdaFunctions::ListLambdaBind
              ((LambdaFunctions *)this,context,bound_function,arguments,
               *(long *)(pBVar8 + 0x78) == 2);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_50._M_head_impl = (Expression *)auStack_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Invalid lambda expression!","");
  duckdb::BinderException::BinderException(this_00,(string *)&local_50);
  __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ListTransformBind(ClientContext &context, ScalarFunction &bound_function,
                                                  vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	bound_function.return_type = LogicalType::LIST(bound_lambda_expr.lambda_expr->return_type);
	auto has_index = bound_lambda_expr.parameter_count == 2;
	return LambdaFunctions::ListLambdaBind(context, bound_function, arguments, has_index);
}